

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20240722::container_internal::hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,int>,bool>,void>,std::allocator<std::pair<std::pair<int,int>const,bool>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::pair<int,_int>,_bool>_> *alloc_ref)

{
  ulong uVar1;
  long lVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = this->old_capacity_;
  if (7 < uVar1) {
    __assert_fail("old_capacity_ < Group::kWidth / 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x82e,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>>, Alloc = std::allocator<std::pair<const std::pair<int, int>, bool>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (uVar1 < c->capacity_)) {
    if (this->was_soo_ == true) {
      __assert_fail("!was_soo_",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x7c2,"void *absl::container_internal::HashSetResizeHelper::old_slots() const")
      ;
    }
    if (this->old_capacity_ != 0) {
      lVar2 = *(long *)((long)&c->heap_or_soo_ + 8);
      puVar3 = *(undefined8 **)((long)&this->old_heap_or_soo_ + 8);
      uVar4 = 0;
      do {
        if (this->was_soo_ == true) {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7be,
                        "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const");
        }
        if (kSentinel < (this->old_heap_or_soo_).heap.control[uVar4]) {
          uVar5 = uVar4 ^ (uVar1 >> 1) + 1;
          *(undefined4 *)(lVar2 + 8 + uVar5 * 0xc) = *(undefined4 *)(puVar3 + 1);
          *(undefined8 *)(lVar2 + uVar5 * 0xc) = *puVar3;
        }
        uVar4 = uVar4 + 1;
        puVar3 = (undefined8 *)((long)puVar3 + 0xc);
      } while (uVar4 < this->old_capacity_);
    }
    return;
  }
  __assert_fail("IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x82f,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::pair<int, int>, bool>>, Alloc = std::allocator<std::pair<const std::pair<int, int>, bool>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    assert(old_capacity_ < Group::kWidth / 2);
    assert(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    assert(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array());
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());

    size_t shuffle_bit = old_capacity_ / 2 + 1;
    for (size_t i = 0; i < old_capacity_; ++i) {
      if (IsFull(old_ctrl()[i])) {
        size_t new_i = i ^ shuffle_bit;
        SanitizerUnpoisonMemoryRegion(new_slots + new_i, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots + new_i,
                               old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }